

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*> *this_00;
  Array<kj::_::HashBucket> *pAVar1;
  size_t *psVar2;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  **ppRVar3;
  uint uVar4;
  ArrayDisposer *pAVar5;
  Entry *pEVar6;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  *pRVar7;
  Entry *pEVar8;
  uint uVar9;
  uint uVar10;
  Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
  MVar11;
  size_t sVar12;
  Entry *__dest;
  HashBucket *pHVar13;
  ulong uVar14;
  RawBrandedSchema *pRVar15;
  Scope *pSVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  size_t __n;
  Entry *__src;
  HashBucket *pHVar20;
  size_t in_R8;
  Entry *pEVar21;
  ArrayPtr<const_unsigned_char> s;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  SchemaBindingsPair key;
  Array<kj::_::HashBucket> local_70;
  undefined8 *local_58;
  RawBrandedSchema *local_50;
  size_t local_48;
  SchemaBindingsPair local_40;
  
  pSVar16 = bindings.ptr;
  if (bindings.size_ == 0) {
    pRVar15 = &schema->defaultBrand;
  }
  else {
    this_00 = &this->brands;
    local_40.schema = schema;
    local_40.scopeBindings = pSVar16;
    MVar11 = kj::
             Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
             ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
                       ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                         *)this_00,&local_40);
    if (MVar11.ptr == (Entry *)0x0) {
      local_48 = bindings.size_;
      local_50 = (RawBrandedSchema *)kj::Arena::allocateBytes(&this->arena,0x28,8,false);
      local_50->generic = (RawSchema *)0x0;
      local_50->scopes = (Scope *)0x0;
      local_50->dependencies = (Dependency *)0x0;
      local_50->scopeCount = 0;
      local_50->dependencyCount = 0;
      local_50->lazyInitializer = (Initializer *)0x0;
      pEVar21 = (this->brands).table.rows.builder.ptr;
      lVar18 = (long)(this->brands).table.rows.builder.pos - (long)pEVar21 >> 3;
      lVar19 = lVar18 * -0x5555555555555555;
      pHVar13 = (HashBucket *)(this->brands).table.indexes.buckets.size_;
      uVar17 = (long)pHVar13 * 2;
      if (uVar17 < ((this->brands).table.indexes.erasedCount + lVar19) * 3 + 3) {
        pAVar1 = &(this->brands).table.indexes.buckets;
        uVar14 = lVar18 * 0x5555555555555556 + 2;
        if (uVar14 < uVar17) {
          uVar14 = uVar17;
        }
        oldBuckets.size_ = uVar14;
        oldBuckets.ptr = pHVar13;
        kj::_::rehash(&local_70,(_ *)pAVar1->ptr,oldBuckets,in_R8);
        pHVar13 = pAVar1->ptr;
        if (pHVar13 != (HashBucket *)0x0) {
          sVar12 = (this->brands).table.indexes.buckets.size_;
          pAVar1->ptr = (HashBucket *)0x0;
          (this->brands).table.indexes.buckets.size_ = 0;
          pAVar5 = (this->brands).table.indexes.buckets.disposer;
          (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pHVar13,8,sVar12,sVar12,0);
        }
        (this->brands).table.indexes.buckets.ptr = local_70.ptr;
        (this->brands).table.indexes.buckets.size_ = local_70.size_;
        (this->brands).table.indexes.buckets.disposer = local_70.disposer;
      }
      local_70.ptr = (HashBucket *)
                     CONCAT44(bindings.ptr._4_4_ * 0xbfe3 + (int)bindings.ptr,
                              (int)((ulong)schema >> 0x20) * 0xbfe3 + (int)schema);
      s.size_ = 8;
      s.ptr = (uchar *)&local_70;
      uVar9 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
      uVar10 = kj::_::chooseBucket((uint)(uVar9 != 0),
                                   (uint)(this->brands).table.indexes.buckets.size_);
      pHVar13 = (HashBucket *)0x0;
      do {
        pHVar20 = (this->brands).table.indexes.buckets.ptr + uVar10;
        uVar4 = pHVar20->value;
        if (uVar4 == 1) {
          if (pHVar13 == (HashBucket *)0x0) {
            pHVar13 = pHVar20;
          }
        }
        else {
          if (uVar4 == 0) {
            if (pHVar13 != (HashBucket *)0x0) {
              psVar2 = &(this->brands).table.indexes.erasedCount;
              *psVar2 = *psVar2 - 1;
              pHVar20 = pHVar13;
            }
            *pHVar20 = (HashBucket)(((ulong)(uVar9 != 0) | lVar19 << 0x20) + 0x200000000);
            pEVar21 = (this->brands).table.rows.builder.pos;
            if (pEVar21 == (this->brands).table.rows.builder.endPtr) {
              pEVar6 = (this_00->table).rows.builder.ptr;
              lVar18 = (long)pEVar21 - (long)pEVar6 >> 3;
              uVar14 = lVar18 * -0x5555555555555555;
              uVar17 = 4;
              if (pEVar21 != pEVar6) {
                uVar17 = lVar18 * 0x5555555555555556;
              }
              if (uVar17 <= uVar14 && uVar14 - uVar17 != 0) {
                (this->brands).table.rows.builder.pos = pEVar6 + uVar17;
              }
              __dest = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                          (0x18,0,uVar17,(_func_void_void_ptr *)0x0,
                                           (_func_void_void_ptr *)0x0);
              pEVar6 = __dest + uVar17;
              local_58 = &kj::_::HeapArrayDisposer::instance;
              __src = (this->brands).table.rows.builder.ptr;
              __n = (long)(this->brands).table.rows.builder.pos - (long)__src;
              local_70.ptr = (HashBucket *)__dest;
              local_70.disposer = (ArrayDisposer *)pEVar6;
              if (__n != 0) {
                memcpy(__dest,__src,__n);
                __src = (this_00->table).rows.builder.ptr;
              }
              pEVar21 = (Entry *)((long)__dest + __n);
              if (__src != (Entry *)0x0) {
                pRVar7 = (this->brands).table.rows.builder.pos;
                pEVar8 = (this->brands).table.rows.builder.endPtr;
                (this_00->table).rows.builder.ptr = (Entry *)0x0;
                (this->brands).table.rows.builder.pos =
                     (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                      *)0x0;
                (this->brands).table.rows.builder.endPtr = (Entry *)0x0;
                pAVar5 = (this->brands).table.rows.builder.disposer;
                local_70.size_ = (size_t)pEVar21;
                (**pAVar5->_vptr_ArrayDisposer)
                          (pAVar5,__src,0x18,((long)pRVar7 - (long)__src >> 3) * -0x5555555555555555
                           ,((long)pEVar8 - (long)__src >> 3) * -0x5555555555555555,0);
              }
              (this->brands).table.rows.builder.ptr = __dest;
              (this->brands).table.rows.builder.pos = pEVar21;
              (this->brands).table.rows.builder.endPtr = pEVar6;
              (this->brands).table.rows.builder.disposer =
                   (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
            }
            (pEVar21->key).schema = schema;
            (pEVar21->key).scopeBindings = pSVar16;
            pEVar21->value = local_50;
            ppRVar3 = &(this->brands).table.rows.builder.pos;
            *ppRVar3 = *ppRVar3 + 1;
            local_50->generic = schema;
            local_50->scopes = pSVar16;
            local_50->scopeCount = (uint32_t)local_48;
            local_50->lazyInitializer = &(this->brandedInitializer).super_Initializer;
            return local_50;
          }
          if (((pHVar20->hash == (uint)(uVar9 != 0)) && (pEVar21[uVar4 - 2].key.schema == schema))
             && (pEVar21[uVar4 - 2].key.scopeBindings == pSVar16)) {
            kj::_::throwDuplicateTableRow();
          }
        }
        sVar12 = (ulong)uVar10 + 1;
        uVar10 = (uint)sVar12;
        if (sVar12 == (this->brands).table.indexes.buckets.size_) {
          uVar10 = 0;
        }
      } while( true );
    }
    pRVar15 = (MVar11.ptr)->value;
  }
  return pRVar15;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  // Note that even if `bindings` is empty, we never want to return defaultBrand here because
  // defaultBrand has special status. Normally, the lack of bindings means all parameters are
  // "unspecified", which means their bindings are unknown and should be treated as AnyPointer.
  // But defaultBrand represents a special case where all parameters are still parameters -- they
  // haven't been bound in the first place. defaultBrand is used to represent the unbranded generic
  // type, while a no-binding brand is equivalent to binding all parameters to AnyPointer.

  if (bindings.size() == 0) {
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_MAYBE(existing, brands.find(key)) {
    return *existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }